

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storage.hpp
# Opt level: O2

void __thiscall
benchmarks::StorageArray<boost::signals2::scoped_connection>::StorageArray
          (StorageArray<boost::signals2::scoped_connection> *this,int64_t size)

{
  int64_t *piVar1;
  
  this->_size = size;
  piVar1 = (int64_t *)operator_new__(-(ulong)((ulong)size >> 0x3c != 0) | size << 4 | 8);
  *piVar1 = size;
  this->_arr = (Storage<boost::signals2::scoped_connection> *)(piVar1 + 1);
  return;
}

Assistant:

StorageArray(int64_t size)
			: _size(size)
		{ _arr = new Storage<T_>[size]; }